

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line-parser.cpp
# Opt level: O1

void license::printBasicHelp(char *prog_name)

{
  ostream *poVar1;
  size_t sVar2;
  long *plVar3;
  allocator local_59;
  char *local_58;
  long local_50;
  char local_48 [16];
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  printHelpHeader(prog_name);
  std::__cxx11::string::string((string *)local_38,prog_name,&local_59);
  boost::filesystem::path::filename();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_58,local_50);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," [command] [options]",0x14);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             " available commands: \"project initialize\", \"project list\", \"license issue\", \"license list\""
             ,0x5a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," to see specific command options type: ",0x27);
  if (prog_name == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5405f0);
  }
  else {
    sVar2 = strlen(prog_name);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,prog_name,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," [command] --help",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
  std::ostream::put(-0x10);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

static void printBasicHelp(const char *prog_name) {
	printHelpHeader(prog_name);
	cout << fs::path(prog_name).filename().string() << " [command] [options]" << endl;
	cout << " available commands: \"project initialize\", \"project list\", \"license issue\", \"license list\""
		 << endl;
	cout << " to see specific command options type: " << prog_name << " [command] --help" << endl << endl;
}